

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void world_spawn_npcs(void *world_void)

{
  Map *pMVar1;
  bool bVar2;
  bool bVar3;
  mapped_type *pmVar4;
  vector<Map_*,_std::allocator<Map_*>_> *this;
  reference ppMVar5;
  reference ppNVar6;
  ENF_Data *pEVar7;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  *this_00;
  double dVar8;
  bool local_eb;
  bool local_ea;
  bool local_e9;
  allocator<char> local_c1;
  key_type local_c0;
  NPC *local_a0;
  NPC *npc;
  iterator __end2;
  iterator __begin2;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range2;
  Map *map;
  iterator __end1;
  iterator __begin1;
  vector<Map_*,_std::allocator<Map_*>_> *__range1;
  double current_time;
  allocator<char> local_41;
  key_type local_40;
  double local_20;
  double spawnrate;
  World *world;
  void *world_void_local;
  
  spawnrate = (double)world_void;
  world = (World *)world_void;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SpawnRate",&local_41);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)((long)world_void + 0x198),&local_40);
  dVar8 = util::variant::operator_cast_to_double(pmVar4);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = dVar8;
  dVar8 = Timer::GetTime();
  this = (vector<Map_*,_std::allocator<Map_*>_> *)((long)spawnrate + 0x4c8);
  __end1 = std::vector<Map_*,_std::allocator<Map_*>_>::begin(this);
  map = (Map *)std::vector<Map_*,_std::allocator<Map_*>_>::end(this);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>
                                     *)&map), bVar3) {
    ppMVar5 = __gnu_cxx::__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::
              operator*(&__end1);
    pMVar1 = *ppMVar5;
    __end2 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(&pMVar1->npcs);
    npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&pMVar1->npcs);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                       *)&npc), bVar3) {
      ppNVar6 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
                operator*(&__end2);
      local_a0 = *ppNVar6;
      bVar2 = false;
      bVar3 = false;
      local_e9 = false;
      if (((local_a0->alive & 1U) == 0) &&
         (local_e9 = false,
         (double)(int)local_a0->spawn_time * local_20 + local_a0->dead_since < dVar8)) {
        pEVar7 = NPC::ENF(local_a0);
        local_ea = true;
        if (pEVar7->child != 0) {
          local_eb = false;
          if ((local_a0->parent != (NPC *)0x0) &&
             (local_eb = false, (local_a0->parent->alive & 1U) != 0)) {
            this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       *)((long)spawnrate + 0x198);
            std::allocator<char>::allocator();
            bVar2 = true;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"RespawnBossChildren",&local_c1);
            bVar3 = true;
            pmVar4 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                     ::operator[](this_00,&local_c0);
            local_eb = util::variant::operator_cast_to_bool(pmVar4);
          }
          local_ea = local_eb;
        }
        local_e9 = local_ea;
      }
      if (bVar3) {
        std::__cxx11::string::~string((string *)&local_c0);
      }
      if (bVar2) {
        std::allocator<char>::~allocator(&local_c1);
      }
      if (local_e9 != false) {
        NPC::Spawn(local_a0,(NPC *)0x0);
      }
      __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
                (&__end2);
    }
    __gnu_cxx::__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void world_spawn_npcs(void *world_void)
{
	World *world(static_cast<World *>(world_void));

	double spawnrate = world->config["SpawnRate"];
	double current_time = Timer::GetTime();
	UTIL_FOREACH(world->maps, map)
	{
		UTIL_FOREACH(map->npcs, npc)
		{
			if ((!npc->alive && npc->dead_since + (double(npc->spawn_time) * spawnrate) < current_time)
			 && (!npc->ENF().child || (npc->parent && npc->parent->alive && world->config["RespawnBossChildren"])))
			{
#ifdef DEBUG
				Console::Dbg("Spawning NPC %i on map %i", npc->id, map->id);
#endif // DEBUG
				npc->Spawn();
			}
		}
	}
}